

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O2

string * __thiscall
flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
          (string *__return_storage_ptr__,void *this,BaseType base_type)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "uint8";
    __a = &local_9;
    break;
  case 1:
    __s = "uint8";
    __a = &local_a;
    break;
  case 2:
    __s = "bool";
    __a = &local_b;
    break;
  case 3:
    __s = "int8";
    __a = &local_c;
    break;
  case 4:
    __s = "uint8";
    __a = &local_d;
    break;
  case 5:
    __s = "int16";
    __a = &local_e;
    break;
  case 6:
    __s = "uint16";
    __a = &local_f;
    break;
  case 7:
    __s = "int32";
    __a = &local_10;
    break;
  case 8:
    __s = "uint32";
    __a = &local_11;
    break;
  case 9:
    __s = "int64";
    __a = &local_12;
    break;
  case 10:
    __s = "uint64";
    __a = &local_13;
    break;
  case 0xb:
    __s = "float32";
    __a = &local_14;
    break;
  case 0xc:
    __s = "float64";
    __a = &local_15;
    break;
  case 0xd:
    __s = "string";
    __a = &local_16;
    break;
  default:
    if ((uint)this < 0x14) {
      __s = *(char **)(reflection::EnumNamesBaseType()::names + ((ulong)this & 0xffffffff) * 8);
    }
    else {
      __s = "";
    }
    __a = &local_17;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateType(const r::BaseType base_type) const {
    switch (base_type) {
      case r::None: return "uint8";
      case r::UType: return "uint8";
      case r::Bool: return "bool";
      case r::Byte: return "int8";
      case r::UByte: return "uint8";
      case r::Short: return "int16";
      case r::UShort: return "uint16";
      case r::Int: return "int32";
      case r::UInt: return "uint32";
      case r::Long: return "int64";
      case r::ULong: return "uint64";
      case r::Float: return "float32";
      case r::Double: return "float64";
      case r::String: return "string";
      default: return r::EnumNameBaseType(base_type);
    }
  }